

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  sunrealtype ahati;
  sunrealtype ai;
  int retval;
  int is;
  sunrealtype chati;
  sunrealtype ci;
  N_Vector curr_stage;
  N_Vector prev_stage;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  void *user_data;
  ARKodeMem in_stack_ffffffffffffffa8;
  N_Vector f1;
  int iVar3;
  double tcur;
  ARKodeSPRKStepMem step_mem_00;
  undefined8 local_30;
  int local_4;
  
  step_mem_00 = (ARKodeSPRKStepMem)0x0;
  tcur = 0.0;
  local_4 = sprkStep_AccessStepMem
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
  if (local_4 == 0) {
    uVar1 = *(undefined8 *)(in_RDI + 0x248);
    iVar2 = 0;
    local_30 = *(undefined8 *)(in_RDI + 0x250);
    for (iVar3 = 0; iVar3 < *(int *)(lRam0000000000000000 + 4); iVar3 = iVar3 + 1) {
      f1 = *(N_Vector *)(*(long *)(lRam0000000000000000 + 8) + (long)iVar3 * 8);
      user_data = *(void **)(*(long *)(lRam0000000000000000 + 0x10) + (long)iVar3 * 8);
      step_mem_00 = (ARKodeSPRKStepMem)((double)f1 + (double)step_mem_00);
      tcur = (double)user_data + tcur;
      iRam0000000000000040 = iVar3;
      N_VConst(0,uRam0000000000000010);
      iVar2 = sprkStep_f1(step_mem_00,tcur,(N_Vector)CONCAT44(iVar3,iVar2),f1,user_data);
      if (iVar2 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * (double)user_data,local_30,
                   uRam0000000000000010,uVar1);
      *(double *)(in_RDI + 0x2f0) = tcur * *(double *)(in_RDI + 0x2c0) + *(double *)(in_RDI + 0x380)
      ;
      N_VConst(0,uRam0000000000000010);
      iVar2 = sprkStep_f2(step_mem_00,tcur,(N_Vector)CONCAT44(iVar3,iVar2),f1,user_data);
      if (iVar2 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * (double)f1,uVar1,
                   uRam0000000000000010,uVar1);
      if (*(long *)(in_RDI + 0x400) != 0) {
        iVar2 = (**(code **)(in_RDI + 0x400))
                          (*(undefined8 *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                           *(undefined8 *)(in_RDI + 0x10));
        if (iVar2 != 0) {
          return -0x26;
        }
        iVar2 = 0;
      }
      iRam0000000000000040 = iRam0000000000000040 + 1;
      local_30 = uVar1;
    }
    *in_RDX = 0;
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sprkStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector prev_stage        = NULL;
  N_Vector curr_stage        = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  prev_stage = ark_mem->yn;
  curr_stage = ark_mem->ycur;
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, t = " SUN_FORMAT_G ", that = " SUN_FORMAT_G, is,
               ark_mem->tn + ci * ark_mem->h, ark_mem->tn + chati * ark_mem->h);
    SUNLogExtraDebugVec(ARK_LOGGER, "stage", prev_stage, "z2_%i(:) =", is);

    /* evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h, prev_stage,
                         step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f1_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* position update */
    N_VLinearSum(ONE, prev_stage, ark_mem->h * ahati, step_mem->sdata,
                 curr_stage);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage", curr_stage, "z1_%i(:) =", is);

    /* evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h, curr_stage,
                         step_mem->sdata, ark_mem->user_data);

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", step_mem->sdata,
                        "f2_%i(:) =", is);

    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* velocity update */
    N_VLinearSum(ONE, curr_stage, ark_mem->h * ai, step_mem->sdata, curr_stage);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
    }

    /* keep track of the stage number */
    step_mem->istage++;

    prev_stage = curr_stage;

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  }

  *nflagPtr = 0;
  *dsmPtr   = 0;

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return ARK_SUCCESS;
}